

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O1

bool __thiscall capnp::SchemaLoader::Validator::validate(Validator *this,Reader *node)

{
  uint uVar1;
  undefined2 uVar2;
  uint64_t scopeId;
  undefined1 uVar3;
  int iVar4;
  CapTableReader *pCVar5;
  ArrayPtr<const_char> AVar6;
  Fault f;
  anon_class_16_2_3fe397bd _kjContextFunc221;
  ContextImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_schema_loader_c__:221:5)>
  _kjContext221;
  undefined1 local_e8 [56];
  Validator *local_b0;
  Reader *local_a8;
  PointerReader local_a0;
  undefined1 local_80 [24];
  int local_68;
  Validator **local_38;
  
  this->isValid = true;
  iVar4 = 0x7fffffff;
  if ((node->_reader).pointerCount == 0) {
    local_80._8_8_ = (ExceptionCallback *)0x0;
    local_80._16_8_ = (WirePointer *)0x0;
    local_80._0_8_ = (SegmentReader *)0x0;
    local_68 = 0x7fffffff;
  }
  else {
    local_80._0_8_ = (node->_reader).segment;
    local_80._8_8_ = (node->_reader).capTable;
    local_80._16_8_ = (node->_reader).pointers;
    local_68 = (node->_reader).nestingLimit;
  }
  pCVar5 = (CapTableReader *)0x0;
  AVar6 = (ArrayPtr<const_char>)
          _::PointerReader::getBlob<capnp::Text>((PointerReader *)local_80,(void *)0x0,0);
  (this->nodeName).super_StringPtr.content = AVar6;
  kj::_::BTreeImpl::clear(&(this->dependencies).table.indexes.impl);
  (this->dependencies).table.rows.builder.pos = (this->dependencies).table.rows.builder.ptr;
  local_b0 = this;
  local_a8 = node;
  kj::_::Debug::Context::Context((Context *)local_80);
  local_80._0_8_ = &PTR__Context_001c9f58;
  local_a0.pointer = (WirePointer *)0x0;
  local_a0.segment = (SegmentReader *)0x0;
  if (5 < (node->_reader).pointerCount) {
    local_a0.segment = (node->_reader).segment;
    pCVar5 = (node->_reader).capTable;
    local_a0.pointer = (node->_reader).pointers + 5;
    iVar4 = (node->_reader).nestingLimit;
  }
  local_a0.capTable = pCVar5;
  local_a0.nestingLimit = iVar4;
  local_38 = &local_b0;
  _::PointerReader::getList((ListReader *)local_e8,&local_a0,INLINE_COMPOSITE,(word *)0x0);
  if ((local_e8._24_4_ == 0) ||
     ((0x120 < (node->_reader).dataSize && ((*(byte *)((long)(node->_reader).data + 0x24) & 1) != 0)
      ))) {
    uVar1 = (node->_reader).dataSize;
    if (uVar1 < 0x70) {
      uVar2 = 0;
    }
    else {
      uVar2 = *(undefined2 *)((long)(node->_reader).data + 0xc);
    }
    switch(uVar2) {
    case 1:
      local_e8._0_8_ = (node->_reader).segment;
      local_e8._8_8_ = (node->_reader).capTable;
      local_e8._16_8_ = (node->_reader).data;
      local_e8._24_8_ = (node->_reader).pointers;
      local_e8._32_4_ = (node->_reader).dataSize;
      local_e8._36_2_ = (node->_reader).pointerCount;
      local_e8[0x26] = (node->_reader).field_0x26;
      local_e8[0x27] = (node->_reader).field_0x27;
      local_e8._40_4_ = (node->_reader).nestingLimit;
      local_e8._44_4_ = *(undefined4 *)&(node->_reader).field_0x2c;
      if (uVar1 < 0xc0) {
        scopeId = 0;
      }
      else {
        scopeId = *(uint64_t *)((long)(node->_reader).data + 0x10);
      }
      validate(this,(Reader *)local_e8,scopeId);
      break;
    case 2:
      local_e8._0_8_ = (node->_reader).segment;
      local_e8._8_8_ = (node->_reader).capTable;
      local_e8._16_8_ = (node->_reader).data;
      local_e8._24_8_ = (node->_reader).pointers;
      local_e8._32_4_ = (node->_reader).dataSize;
      local_e8._36_2_ = (node->_reader).pointerCount;
      local_e8[0x26] = (node->_reader).field_0x26;
      local_e8[0x27] = (node->_reader).field_0x27;
      local_e8._40_4_ = (node->_reader).nestingLimit;
      local_e8._44_4_ = *(undefined4 *)&(node->_reader).field_0x2c;
      validate(this,(Reader *)local_e8);
      break;
    case 3:
      local_e8._0_8_ = (node->_reader).segment;
      local_e8._8_8_ = (node->_reader).capTable;
      local_e8._16_8_ = (node->_reader).data;
      local_e8._24_8_ = (node->_reader).pointers;
      local_e8._32_4_ = (node->_reader).dataSize;
      local_e8._36_2_ = (node->_reader).pointerCount;
      local_e8[0x26] = (node->_reader).field_0x26;
      local_e8[0x27] = (node->_reader).field_0x27;
      local_e8._40_4_ = (node->_reader).nestingLimit;
      local_e8._44_4_ = *(undefined4 *)&(node->_reader).field_0x2c;
      validate(this,(Reader *)local_e8);
      break;
    case 4:
      local_e8._0_8_ = (node->_reader).segment;
      local_e8._8_8_ = (node->_reader).capTable;
      local_e8._16_8_ = (node->_reader).data;
      local_e8._24_8_ = (node->_reader).pointers;
      local_e8._32_4_ = (node->_reader).dataSize;
      local_e8._36_2_ = (node->_reader).pointerCount;
      local_e8[0x26] = (node->_reader).field_0x26;
      local_e8[0x27] = (node->_reader).field_0x27;
      local_e8._40_4_ = (node->_reader).nestingLimit;
      local_e8._44_4_ = *(undefined4 *)&(node->_reader).field_0x2c;
      validate(this,(Reader *)local_e8);
      break;
    case 5:
      if ((node->_reader).pointerCount < 4) {
        local_a0.nestingLimit = 0x7fffffff;
        local_a0.capTable = (CapTableReader *)0x0;
        local_a0.pointer = (WirePointer *)0x0;
        local_a0.segment = (SegmentReader *)0x0;
      }
      else {
        local_a0.segment = (node->_reader).segment;
        local_a0.capTable = (node->_reader).capTable;
        local_a0.nestingLimit = (node->_reader).nestingLimit;
        local_a0.pointer = (node->_reader).pointers + 3;
      }
      _::PointerReader::getStruct((StructReader *)local_e8,&local_a0,(word *)0x0);
      validate(this,(Reader *)local_e8);
    }
    uVar3 = this->isValid;
  }
  else {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[55]>
              ((Fault *)local_e8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0xe0,FAILED,"node.getIsGeneric()",
               "\"if parameter list is non-empty, isGeneric must be true\"",
               (char (*) [55])"if parameter list is non-empty, isGeneric must be true");
    this->isValid = false;
    kj::_::Debug::Fault::~Fault((Fault *)local_e8);
    uVar3 = 0;
  }
  kj::_::Debug::Context::~Context((Context *)local_80);
  return (bool)uVar3;
}

Assistant:

bool validate(const schema::Node::Reader& node) {
    isValid = true;
    nodeName = node.getDisplayName();
    dependencies.clear();

    KJ_CONTEXT("validating schema node", nodeName, (uint)node.which());

    if (node.getParameters().size() > 0) {
      KJ_REQUIRE(node.getIsGeneric(), "if parameter list is non-empty, isGeneric must be true") {
        isValid = false;
        return false;
      }
    }

    switch (node.which()) {
      case schema::Node::FILE:
        verifyVoid(node.getFile());
        break;
      case schema::Node::STRUCT:
        validate(node.getStruct(), node.getScopeId());
        break;
      case schema::Node::ENUM:
        validate(node.getEnum());
        break;
      case schema::Node::INTERFACE:
        validate(node.getInterface());
        break;
      case schema::Node::CONST:
        validate(node.getConst());
        break;
      case schema::Node::ANNOTATION:
        validate(node.getAnnotation());
        break;
    }

    // We accept and pass through node types we don't recognize.
    return isValid;
  }